

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

NodeSet * __thiscall
capnp::compiler::NodeTranslator::getBootstrapNode
          (NodeSet *__return_storage_ptr__,NodeTranslator *this)

{
  AuxNode *pAVar1;
  Reader *pRVar2;
  AuxNode *group;
  AuxNode *pAVar3;
  ArrayBuilder<capnp::schema::Node::Reader> builder;
  ReaderFor<capnp::schema::Node> nodeReader;
  Reader *local_d8;
  Reader *local_d0;
  Reader *local_b0;
  StructReader local_90;
  StructReader local_60;
  
  pRVar2 = (Reader *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x30,0,((long)(this->groups).builder.pos - (long)(this->groups).builder.ptr >>
                             6) + ((long)(this->paramStructs).builder.pos -
                                   (long)(this->paramStructs).builder.ptr >> 6) + 1,
                      (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  capnp::_::OrphanBuilder::asStructReader(&local_90,&(this->sourceInfo).builder,(StructSize)0x20001)
  ;
  (pRVar2->_reader).dataSize = local_90.dataSize;
  (pRVar2->_reader).pointerCount = local_90.pointerCount;
  *(undefined2 *)&(pRVar2->_reader).field_0x26 = local_90._38_2_;
  (pRVar2->_reader).nestingLimit = local_90.nestingLimit;
  *(undefined4 *)&(pRVar2->_reader).field_0x2c = local_90._44_4_;
  (pRVar2->_reader).data = local_90.data;
  (pRVar2->_reader).pointers = local_90.pointers;
  (pRVar2->_reader).segment = local_90.segment;
  (pRVar2->_reader).capTable = local_90.capTable;
  local_b0 = pRVar2 + 1;
  pAVar3 = (this->groups).builder.ptr;
  pAVar1 = (this->groups).builder.pos;
  if (pAVar3 != pAVar1) {
    do {
      capnp::_::OrphanBuilder::asStructReader
                (&local_90,&(pAVar3->sourceInfo).builder,(StructSize)0x20001);
      (local_b0->_reader).dataSize = local_90.dataSize;
      (local_b0->_reader).pointerCount = local_90.pointerCount;
      *(undefined2 *)&(local_b0->_reader).field_0x26 = local_90._38_2_;
      (local_b0->_reader).nestingLimit = local_90.nestingLimit;
      *(undefined4 *)&(local_b0->_reader).field_0x2c = local_90._44_4_;
      (local_b0->_reader).data = local_90.data;
      (local_b0->_reader).pointers = local_90.pointers;
      (local_b0->_reader).segment = local_90.segment;
      (local_b0->_reader).capTable = local_90.capTable;
      local_b0 = local_b0 + 1;
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar1);
  }
  pAVar3 = (this->paramStructs).builder.ptr;
  pAVar1 = (this->paramStructs).builder.pos;
  if (pAVar3 != pAVar1) {
    do {
      capnp::_::OrphanBuilder::asStructReader
                (&local_90,&(pAVar3->sourceInfo).builder,(StructSize)0x20001);
      (local_b0->_reader).dataSize = local_90.dataSize;
      (local_b0->_reader).pointerCount = local_90.pointerCount;
      *(undefined2 *)&(local_b0->_reader).field_0x26 = local_90._38_2_;
      (local_b0->_reader).nestingLimit = local_90.nestingLimit;
      *(undefined4 *)&(local_b0->_reader).field_0x2c = local_90._44_4_;
      (local_b0->_reader).data = local_90.data;
      (local_b0->_reader).pointers = local_90.pointers;
      (local_b0->_reader).segment = local_90.segment;
      (local_b0->_reader).capTable = local_90.capTable;
      local_b0 = local_b0 + 1;
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar1);
  }
  capnp::_::OrphanBuilder::asStructReader(&local_60,&(this->wipNode).builder,(StructSize)0x60005);
  if ((local_60.dataSize < 0x70) || (*(short *)((long)local_60.data + 0xc) != 3)) {
    (__return_storage_ptr__->node)._reader.dataSize = local_60.dataSize;
    (__return_storage_ptr__->node)._reader.pointerCount = local_60.pointerCount;
    *(short *)&(__return_storage_ptr__->node)._reader.field_0x26 = local_60._38_2_;
    (__return_storage_ptr__->node)._reader.nestingLimit = local_60.nestingLimit;
    *(undefined4 *)&(__return_storage_ptr__->node)._reader.field_0x2c = local_60._44_4_;
    (__return_storage_ptr__->node)._reader.data = local_60.data;
    (__return_storage_ptr__->node)._reader.pointers = local_60.pointers;
    (__return_storage_ptr__->node)._reader.segment = local_60.segment;
    (__return_storage_ptr__->node)._reader.capTable = local_60.capTable;
    local_d8 = (Reader *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x30,0,(long)(this->groups).builder.pos - (long)(this->groups).builder.ptr
                                 >> 6,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pAVar3 = (this->groups).builder.ptr;
    local_d0 = local_d8;
    if (pAVar3 != (this->groups).builder.pos) {
      do {
        capnp::_::OrphanBuilder::asStructReader
                  (&local_90,(OrphanBuilder *)pAVar3,(StructSize)0x60005);
        (local_d0->_reader).dataSize = local_90.dataSize;
        (local_d0->_reader).pointerCount = local_90.pointerCount;
        *(undefined2 *)&(local_d0->_reader).field_0x26 = local_90._38_2_;
        (local_d0->_reader).nestingLimit = local_90.nestingLimit;
        *(undefined4 *)&(local_d0->_reader).field_0x2c = local_90._44_4_;
        (local_d0->_reader).data = local_90.data;
        (local_d0->_reader).pointers = local_90.pointers;
        (local_d0->_reader).segment = local_90.segment;
        (local_d0->_reader).capTable = local_90.capTable;
        local_d0 = local_d0 + 1;
        pAVar3 = pAVar3 + 1;
      } while (pAVar3 != (this->groups).builder.pos);
    }
  }
  else {
    (__return_storage_ptr__->node)._reader.dataSize = local_60.dataSize;
    (__return_storage_ptr__->node)._reader.pointerCount = local_60.pointerCount;
    *(short *)&(__return_storage_ptr__->node)._reader.field_0x26 = local_60._38_2_;
    (__return_storage_ptr__->node)._reader.nestingLimit = local_60.nestingLimit;
    *(undefined4 *)&(__return_storage_ptr__->node)._reader.field_0x2c = local_60._44_4_;
    (__return_storage_ptr__->node)._reader.data = local_60.data;
    (__return_storage_ptr__->node)._reader.pointers = local_60.pointers;
    (__return_storage_ptr__->node)._reader.segment = local_60.segment;
    (__return_storage_ptr__->node)._reader.capTable = local_60.capTable;
    local_d8 = (Reader *)
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x30,0,(long)(this->paramStructs).builder.pos -
                                 (long)(this->paramStructs).builder.ptr >> 6,
                          (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pAVar3 = (this->paramStructs).builder.ptr;
    local_d0 = local_d8;
    if (pAVar3 != (this->paramStructs).builder.pos) {
      do {
        capnp::_::OrphanBuilder::asStructReader
                  (&local_90,(OrphanBuilder *)pAVar3,(StructSize)0x60005);
        (local_d0->_reader).dataSize = local_90.dataSize;
        (local_d0->_reader).pointerCount = local_90.pointerCount;
        *(undefined2 *)&(local_d0->_reader).field_0x26 = local_90._38_2_;
        (local_d0->_reader).nestingLimit = local_90.nestingLimit;
        *(undefined4 *)&(local_d0->_reader).field_0x2c = local_90._44_4_;
        (local_d0->_reader).data = local_90.data;
        (local_d0->_reader).pointers = local_90.pointers;
        (local_d0->_reader).segment = local_90.segment;
        (local_d0->_reader).capTable = local_90.capTable;
        local_d0 = local_d0 + 1;
        pAVar3 = pAVar3 + 1;
      } while (pAVar3 != (this->paramStructs).builder.pos);
    }
  }
  (__return_storage_ptr__->auxNodes).ptr = local_d8;
  (__return_storage_ptr__->auxNodes).size_ =
       ((long)local_d0 - (long)local_d8 >> 4) * -0x5555555555555555;
  (__return_storage_ptr__->auxNodes).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  (__return_storage_ptr__->sourceInfo).ptr = pRVar2;
  (__return_storage_ptr__->sourceInfo).size_ =
       ((long)local_b0 - (long)pRVar2 >> 4) * -0x5555555555555555;
  (__return_storage_ptr__->sourceInfo).disposer =
       (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::NodeSet NodeTranslator::getBootstrapNode() {
  auto sourceInfos = kj::heapArrayBuilder<schema::Node::SourceInfo::Reader>(
      1 + groups.size() + paramStructs.size());
  sourceInfos.add(sourceInfo.getReader());
  for (auto& group: groups) {
    sourceInfos.add(group.sourceInfo.getReader());
  }
  for (auto& paramStruct: paramStructs) {
    sourceInfos.add(paramStruct.sourceInfo.getReader());
  }

  auto nodeReader = wipNode.getReader();
  if (nodeReader.isInterface()) {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, paramStructs) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  } else {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, groups) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  }
}